

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.h
# Opt level: O3

size_t __thiscall axl::sl::PackerSeq::append<axl::sl::Pack<unsigned_char>>(PackerSeq *this)

{
  size_t sVar1;
  Packer **ppPVar2;
  bool bVar3;
  
  callOnce<axl::sl::ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::Pack<unsigned_char>>>,unsigned_char*>
            (&getSimpleSingleton<axl::sl::PackerImpl<axl::sl::Pack<unsigned_char>>>(int*)::buffer,0)
  ;
  sVar1 = (this->m_sequence).
          super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.m_count;
  bVar3 = Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>>::
          setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::Packer*>::Construct>
                    ((Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>> *)
                     &this->m_sequence,sVar1 + 1);
  if ((bVar3) &&
     (ppPVar2 = (this->m_sequence).
                super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.m_p,
     ppPVar2 != (Packer **)0x0)) {
    ppPVar2[sVar1] =
         (Packer *)
         &getSimpleSingleton<axl::sl::PackerImpl<axl::sl::Pack<unsigned_char>>>(int*)::buffer;
  }
  return (this->m_sequence).
         super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.m_count;
}

Assistant:

size_t
	append() {
		return append(PackerImpl<T>::getSingleton());
	}